

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-debugchannel.c
# Opt level: O2

int lwrite(lua_State *L)

{
  spinlock *lock;
  size_t in_RAX;
  undefined8 *puVar1;
  char *__src;
  spinlock *psVar2;
  size_t sz;
  
  sz = in_RAX;
  puVar1 = (undefined8 *)luaL_checkudata(L,1,"debugchannel");
  __src = luaL_checklstring(L,2,&sz);
  lock = (spinlock *)*puVar1;
  puVar1 = (undefined8 *)malloc(sz + 0x10);
  puVar1[1] = sz;
  *puVar1 = 0;
  memcpy(puVar1 + 2,__src,sz);
  spinlock_lock(lock);
  psVar2 = lock + 2;
  if (*(spinlock **)(lock + 4) != (spinlock *)0x0) {
    psVar2 = *(spinlock **)(lock + 4);
  }
  *(undefined8 **)psVar2 = puVar1;
  *(undefined8 **)(lock + 4) = puVar1;
  lock->lock = 0;
  return 0;
}

Assistant:

static int
lwrite(lua_State *L) {
	struct channel_box *cb = luaL_checkudata(L,1, METANAME);
	size_t sz;
	const char * str = luaL_checklstring(L, 2, &sz);
	channel_write(cb->c, str, sz);
	return 0;
}